

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_avx.hpp
# Opt level: O3

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx>::weight_from_cos
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx> *this,
          PolarExtentCoreContext *ctx,batch cos_angle)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  batch *in_RAX;
  undefined1 auVar12 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  
  uVar1 = *(undefined4 *)&this[0xf].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar13._16_4_ = uVar1;
  auVar13._20_4_ = uVar1;
  auVar13._24_4_ = uVar1;
  auVar13._28_4_ = uVar1;
  auVar12 = in_ZMM0._0_32_;
  auVar13 = vcmpps_avx(auVar13,auVar12,2);
  auVar21 = vcmpps_avx(ZEXT432(0) << 0x20,ZEXT432(0) << 0x20,0xf);
  auVar22 = auVar21 & ~auVar13;
  if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0x7f,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar22 >> 0xbf,0) != '\0') ||
      (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0') {
    uVar1 = *(undefined4 *)((long)&this[0xf].super_PolarExtentCore._vptr_PolarExtentCore + 4);
    auVar16._4_4_ = uVar1;
    auVar16._0_4_ = uVar1;
    auVar16._8_4_ = uVar1;
    auVar16._12_4_ = uVar1;
    auVar16._16_4_ = uVar1;
    auVar16._20_4_ = uVar1;
    auVar16._24_4_ = uVar1;
    auVar16._28_4_ = uVar1;
    auVar22 = vcmpps_avx(auVar12,auVar16,2);
    auVar21 = auVar21 & ~auVar22;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0x7f,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar21 >> 0xbf,0) != '\0') ||
        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar21[0x1f] < '\0')
    {
      auVar10 = vpermilps_avx(*(undefined1 (*) [16])(this + 0x11),0);
      auVar14._8_4_ = 0x7fffffff;
      auVar14._0_8_ = 0x7fffffff7fffffff;
      auVar14._12_4_ = 0x7fffffff;
      auVar14._16_4_ = 0x7fffffff;
      auVar14._20_4_ = 0x7fffffff;
      auVar14._24_4_ = 0x7fffffff;
      auVar14._28_4_ = 0x7fffffff;
      auVar21 = vandps_avx(auVar12,auVar14);
      auVar18._8_4_ = 0x3f000000;
      auVar18._0_8_ = 0x3f0000003f000000;
      auVar18._12_4_ = 0x3f000000;
      auVar18._16_4_ = 0x3f000000;
      auVar18._20_4_ = 0x3f000000;
      auVar18._24_4_ = 0x3f000000;
      auVar18._28_4_ = 0x3f000000;
      auVar23._0_4_ = auVar21._0_4_ * 0.5;
      auVar23._4_4_ = auVar21._4_4_ * 0.5;
      auVar23._8_4_ = auVar21._8_4_ * 0.5;
      auVar23._12_4_ = auVar21._12_4_ * 0.5;
      auVar23._16_4_ = auVar21._16_4_ * 0.5;
      auVar23._20_4_ = auVar21._20_4_ * 0.5;
      auVar23._28_36_ = in_ZMM7._28_36_;
      auVar23._24_4_ = auVar21._24_4_ * 0.5;
      auVar22 = vsubps_avx(auVar18,auVar23._0_32_);
      auVar22 = vsqrtps_avx(auVar22);
      auVar17 = vcmpps_avx(auVar18,auVar21,1);
      auVar22 = vblendvps_avx(auVar12,auVar22,auVar17);
      auVar21 = vandps_avx(auVar22,auVar14);
      auVar18 = vcmpps_avx(auVar18,auVar21,1);
      auVar15._8_4_ = 0x3f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      auVar15._12_4_ = 0x3f800000;
      auVar15._16_4_ = 0x3f800000;
      auVar15._20_4_ = 0x3f800000;
      auVar15._24_4_ = 0x3f800000;
      auVar15._28_4_ = 0x3f800000;
      auVar14 = vsubps_avx(auVar15,auVar21);
      auVar9._4_4_ = auVar14._4_4_ * 0.5;
      auVar9._0_4_ = auVar14._0_4_ * 0.5;
      auVar9._8_4_ = auVar14._8_4_ * 0.5;
      auVar9._12_4_ = auVar14._12_4_ * 0.5;
      auVar9._16_4_ = auVar14._16_4_ * 0.5;
      auVar9._20_4_ = auVar14._20_4_ * 0.5;
      auVar9._24_4_ = auVar14._24_4_ * 0.5;
      auVar9._28_4_ = 0x3f000000;
      auVar11._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar11._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar11._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar11._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar11._16_4_ = auVar22._16_4_ * auVar22._16_4_;
      auVar11._20_4_ = auVar22._20_4_ * auVar22._20_4_;
      auVar11._24_4_ = auVar22._24_4_ * auVar22._24_4_;
      auVar11._28_4_ = auVar14._28_4_;
      auVar14 = vblendvps_avx(auVar11,auVar9,auVar18);
      auVar9 = vsqrtps_avx(auVar14);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      auVar27._16_4_ = 0x80000000;
      auVar27._20_4_ = 0x80000000;
      auVar27._24_4_ = 0x80000000;
      auVar27._28_4_ = 0x80000000;
      auVar9 = vblendvps_avx(auVar21,auVar9,auVar18);
      auVar21 = vandps_avx(auVar27,auVar22);
      fVar2 = auVar14._0_4_;
      fVar3 = auVar14._4_4_;
      fVar4 = auVar14._8_4_;
      fVar5 = auVar14._12_4_;
      fVar6 = auVar14._16_4_;
      fVar7 = auVar14._20_4_;
      fVar8 = auVar14._24_4_;
      auVar19._0_4_ =
           auVar9._0_4_ +
           ((((fVar2 * 0.0421632 + 0.024181312) * fVar2 + 0.045470025) * fVar2 + 0.074953005) *
            fVar2 + 0.16666752) * auVar9._0_4_ * fVar2;
      auVar19._4_4_ =
           auVar9._4_4_ +
           ((((fVar3 * 0.0421632 + 0.024181312) * fVar3 + 0.045470025) * fVar3 + 0.074953005) *
            fVar3 + 0.16666752) * auVar9._4_4_ * fVar3;
      auVar19._8_4_ =
           auVar9._8_4_ +
           ((((fVar4 * 0.0421632 + 0.024181312) * fVar4 + 0.045470025) * fVar4 + 0.074953005) *
            fVar4 + 0.16666752) * auVar9._8_4_ * fVar4;
      auVar19._12_4_ =
           auVar9._12_4_ +
           ((((fVar5 * 0.0421632 + 0.024181312) * fVar5 + 0.045470025) * fVar5 + 0.074953005) *
            fVar5 + 0.16666752) * auVar9._12_4_ * fVar5;
      auVar19._16_4_ =
           auVar9._16_4_ +
           ((((fVar6 * 0.0421632 + 0.024181312) * fVar6 + 0.045470025) * fVar6 + 0.074953005) *
            fVar6 + 0.16666752) * auVar9._16_4_ * fVar6;
      auVar19._20_4_ =
           auVar9._20_4_ +
           ((((fVar7 * 0.0421632 + 0.024181312) * fVar7 + 0.045470025) * fVar7 + 0.074953005) *
            fVar7 + 0.16666752) * auVar9._20_4_ * fVar7;
      auVar19._24_4_ =
           auVar9._24_4_ +
           ((((fVar8 * 0.0421632 + 0.024181312) * fVar8 + 0.045470025) * fVar8 + 0.074953005) *
            fVar8 + 0.16666752) * auVar9._24_4_ * fVar8;
      auVar19._28_4_ = auVar9._28_4_ + auVar14._28_4_;
      auVar24._8_4_ = 0x3fc90fdb;
      auVar24._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar24._12_4_ = 0x3fc90fdb;
      auVar24._16_4_ = 0x3fc90fdb;
      auVar24._20_4_ = 0x3fc90fdb;
      auVar24._24_4_ = 0x3fc90fdb;
      auVar24._28_4_ = 0x3fc90fdb;
      auVar26._0_4_ = auVar19._0_4_ + auVar19._0_4_;
      auVar26._4_4_ = auVar19._4_4_ + auVar19._4_4_;
      auVar26._8_4_ = auVar19._8_4_ + auVar19._8_4_;
      auVar26._12_4_ = auVar19._12_4_ + auVar19._12_4_;
      auVar26._16_4_ = auVar19._16_4_ + auVar19._16_4_;
      auVar26._20_4_ = auVar19._20_4_ + auVar19._20_4_;
      auVar26._24_4_ = auVar19._24_4_ + auVar19._24_4_;
      auVar26._28_4_ = auVar19._28_4_ + auVar19._28_4_;
      auVar22 = vsubps_avx(auVar24,auVar26);
      auVar22 = vblendvps_avx(auVar19,auVar22,auVar18);
      auVar20._0_4_ = (float)(auVar21._0_4_ ^ auVar22._0_4_);
      auVar20._4_4_ = (float)(auVar21._4_4_ ^ auVar22._4_4_);
      auVar20._8_4_ = (float)(auVar21._8_4_ ^ auVar22._8_4_);
      auVar20._12_4_ = (float)(auVar21._12_4_ ^ auVar22._12_4_);
      auVar20._16_4_ = (float)(auVar21._16_4_ ^ auVar22._16_4_);
      auVar20._20_4_ = (float)(auVar21._20_4_ ^ auVar22._20_4_);
      auVar20._24_4_ = (float)(auVar21._24_4_ ^ auVar22._24_4_);
      auVar20._28_4_ = (float)(auVar21._28_4_ ^ auVar22._28_4_);
      auVar21._0_4_ = auVar20._0_4_ + auVar20._0_4_;
      auVar21._4_4_ = auVar20._4_4_ + auVar20._4_4_;
      auVar21._8_4_ = auVar20._8_4_ + auVar20._8_4_;
      auVar21._12_4_ = auVar20._12_4_ + auVar20._12_4_;
      auVar21._16_4_ = auVar20._16_4_ + auVar20._16_4_;
      auVar21._20_4_ = auVar20._20_4_ + auVar20._20_4_;
      auVar21._24_4_ = auVar20._24_4_ + auVar20._24_4_;
      auVar21._28_4_ = auVar20._28_4_ + auVar20._28_4_;
      auVar21 = vblendvps_avx(auVar20,auVar21,auVar17);
      auVar22._8_4_ = 0xbf000000;
      auVar22._0_8_ = 0xbf000000bf000000;
      auVar22._12_4_ = 0xbf000000;
      auVar22._16_4_ = 0xbf000000;
      auVar22._20_4_ = 0xbf000000;
      auVar22._24_4_ = 0xbf000000;
      auVar22._28_4_ = 0xbf000000;
      auVar25._8_4_ = 0x40490fdb;
      auVar25._0_8_ = 0x40490fdb40490fdb;
      auVar25._12_4_ = 0x40490fdb;
      auVar25._16_4_ = 0x40490fdb;
      auVar25._20_4_ = 0x40490fdb;
      auVar25._24_4_ = 0x40490fdb;
      auVar25._28_4_ = 0x40490fdb;
      auVar22 = vcmpps_avx(auVar12,auVar22,1);
      auVar14 = vsubps_avx(auVar25,auVar21);
      auVar21 = vblendvps_avx(auVar21,auVar14,auVar22);
      auVar22 = vsubps_avx(auVar24,auVar21);
      auVar21 = vblendvps_avx(auVar22,auVar21,auVar17);
      auVar22 = vperm2f128_avx(auVar12,*(undefined1 (*) [32])(this + 0xf),0x33);
      auVar22 = vshufps_avx(auVar22,auVar22,0x55);
      auVar17._0_4_ = auVar21._0_4_ * auVar10._0_4_ + auVar22._0_4_;
      auVar17._4_4_ = auVar21._4_4_ * auVar10._4_4_ + auVar22._4_4_;
      auVar17._8_4_ = auVar21._8_4_ * auVar10._8_4_ + auVar22._8_4_;
      auVar17._12_4_ = auVar21._12_4_ * auVar10._12_4_ + auVar22._12_4_;
      auVar17._16_4_ = auVar21._16_4_ * auVar10._0_4_ + auVar22._16_4_;
      auVar17._20_4_ = auVar21._20_4_ * auVar10._4_4_ + auVar22._20_4_;
      auVar17._24_4_ = auVar21._24_4_ * auVar10._8_4_ + auVar22._24_4_;
      auVar17._28_4_ = auVar21._28_4_ + auVar22._28_4_;
      auVar21 = vcmpps_avx(auVar12,auVar16,6);
      auVar21 = vandps_avx(auVar21,auVar17);
      vblendvps_avx(auVar21,auVar15,auVar13);
    }
  }
  return in_RAX;
}

Assistant:

inline batch<float, A> broadcast(float val, requires_arch<avx>) noexcept
        {
            return _mm256_set1_ps(val);
        }